

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mbedtls_wrapper.cpp
# Opt level: O2

void __thiscall
duckdb_mbedtls::MbedTlsWrapper::AESStateMBEDTLS::AESStateMBEDTLS(AESStateMBEDTLS *this,string *key)

{
  int iVar1;
  mbedtls_cipher_info_t *cipher_info;
  runtime_error arStack_38 [16];
  runtime_error local_28 [16];
  
  duckdb::EncryptionState::EncryptionState(&this->super_EncryptionState,(string *)0x0);
  *(undefined ***)this = &PTR__AESStateMBEDTLS_004e0ff0;
  this->cipher = GCM;
  duckdb::make_uniq<mbedtls_cipher_context_t>();
  mbedtls_cipher_init((this->context).
                      super_unique_ptr<mbedtls_cipher_context_t,_std::default_delete<mbedtls_cipher_context_t>_>
                      ._M_t.
                      super___uniq_ptr_impl<mbedtls_cipher_context_t,_std::default_delete<mbedtls_cipher_context_t>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_mbedtls_cipher_context_t_*,_std::default_delete<mbedtls_cipher_context_t>_>
                      .super__Head_base<0UL,_mbedtls_cipher_context_t_*,_false>._M_head_impl);
  cipher_info = GetCipher(this,key->_M_string_length);
  if (cipher_info == (mbedtls_cipher_info_t *)0x0) {
    std::runtime_error::runtime_error(local_28,"Failed to get Cipher");
    std::runtime_error::~runtime_error(local_28);
  }
  iVar1 = mbedtls_cipher_setup
                    ((this->context).
                     super_unique_ptr<mbedtls_cipher_context_t,_std::default_delete<mbedtls_cipher_context_t>_>
                     ._M_t.
                     super___uniq_ptr_impl<mbedtls_cipher_context_t,_std::default_delete<mbedtls_cipher_context_t>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_mbedtls_cipher_context_t_*,_std::default_delete<mbedtls_cipher_context_t>_>
                     .super__Head_base<0UL,_mbedtls_cipher_context_t_*,_false>._M_head_impl,
                     cipher_info);
  if (iVar1 != 0) {
    std::runtime_error::runtime_error(arStack_38,"Failed to initialize cipher context");
    std::runtime_error::~runtime_error(arStack_38);
  }
  return;
}

Assistant:

MbedTlsWrapper::AESStateMBEDTLS::AESStateMBEDTLS(const std::string *key) : context(duckdb::make_uniq<mbedtls_cipher_context_t>()) {
	mbedtls_cipher_init(context.get());

	auto cipher_info = GetCipher(key->length());
	if (!cipher_info) {
		runtime_error("Failed to get Cipher");
	}

	if (mbedtls_cipher_setup(context.get(), cipher_info) != 0) {
		runtime_error("Failed to initialize cipher context");
	}
}